

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::HexStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (HexStrOperator *this,string_t input,Vector *result)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 *puVar3;
  long lVar4;
  string_t target;
  undefined1 local_30 [16];
  undefined8 local_20;
  long local_18;
  
  local_18 = input.value._0_8_;
  uVar2 = (ulong)this & 0xffffffff;
  lVar4 = local_18;
  if (uVar2 < 0xd) {
    lVar4 = (long)&local_20 + 4;
  }
  local_20 = this;
  local_30 = (undefined1  [16])
             StringVector::EmptyString
                       (input.value._8_8_,(Vector *)(uVar2 * 2),(idx_t)input.value._8_8_);
  if (uVar2 != 0) {
    puVar3 = (undefined4 *)local_30._8_8_;
    if ((uint)local_30._0_4_ < 0xd) {
      puVar3 = (undefined4 *)(local_30 + 4);
    }
    uVar1 = 0;
    do {
      *(char *)((long)puVar3 + uVar1 * 2) = "0123456789ABCDEF"[*(byte *)(lVar4 + uVar1) >> 4];
      *(char *)((long)puVar3 + uVar1 * 2 + 1) = "0123456789ABCDEF"[*(byte *)(lVar4 + uVar1) & 0xf];
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  uVar2 = (ulong)(uint)local_30._0_4_;
  if (uVar2 < 0xd) {
    switchD_0105dc25::default((void *)((long)(local_30 + 4) + uVar2),0,0xc - uVar2);
  }
  else {
    local_30._4_4_ = *(undefined4 *)local_30._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 2);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			*output = Blob::HEX_TABLE[(data[i] >> 4) & 0x0F];
			output++;
			*output = Blob::HEX_TABLE[data[i] & 0x0F];
			output++;
		}

		target.Finalize();
		return target;
	}